

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

void __thiscall VFS::CVFS::Copy(CVFS *this,string *From,string *To)

{
  bool bVar1;
  CVFSException *pCVar2;
  element_type *peVar3;
  element_type *this_00;
  shared_ptr<VFS::CVFSNode> local_138;
  string local_128;
  undefined1 local_108 [8];
  VFSNode copy;
  shared_ptr<VFS::CVFS::CVFSDir> DestParent;
  VFSNode node;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  VFSNode DestNode;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *To_local;
  string *From_local;
  CVFS *this_local;
  
  local_20 = To;
  To_local = From;
  From_local = &this->MAGIC;
  bVar1 = NodeExists(this,From);
  if (!bVar1) {
    local_55 = '\x01';
    pCVar2 = (CVFSException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Can\'t copy node. Source node doesn\'t exists.",&local_41);
    CVFSException::CVFSException(pCVar2,&local_40,NODE_DOESNT_EXISTS);
    local_55 = '\0';
    __cxa_throw(pCVar2,&CVFSException::typeinfo,CVFSException::~CVFSException);
  }
  bVar1 = NodeExists(this,local_20);
  if (!bVar1) {
    ExtractPath(&local_b0,this,local_20);
    GetNodeInfo((CVFS *)local_90,&this->MAGIC);
    std::__cxx11::string::~string((string *)&local_b0);
    peVar3 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    bVar1 = CVFSNode::IsDir(peVar3);
    if (!bVar1) {
      node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1
      ;
      pCVar2 = (CVFSException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Can\'t copy node. Destination node parent is a file.",
                 (allocator<char> *)
                 ((long)&node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      CVFSException::CVFSException(pCVar2,&local_d0,NODE_IS_FILE);
      node.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0
      ;
      __cxa_throw(pCVar2,&CVFSException::typeinfo,CVFSException::~CVFSException);
    }
    GetNodeInfo((CVFS *)&DestParent.
                         super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,&this->MAGIC);
    std::static_pointer_cast<VFS::CVFS::CVFSDir,VFS::CVFSNode>
              ((shared_ptr<VFS::CVFSNode> *)
               &copy.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar3 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&DestParent.
                            super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    (**peVar3->_vptr_CVFSNode)(local_108);
    ExtractName(&local_128,this,local_20);
    peVar3 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_108);
    std::__cxx11::string::operator=((string *)&peVar3->m_Name,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    this_00 = std::__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&copy.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
    std::shared_ptr<VFS::CVFSNode>::shared_ptr(&local_138,(shared_ptr<VFS::CVFSNode> *)local_108);
    CVFSDir::AppendChild(this_00,&local_138);
    std::shared_ptr<VFS::CVFSNode>::~shared_ptr(&local_138);
    std::shared_ptr<VFS::CVFSNode>::~shared_ptr((shared_ptr<VFS::CVFSNode> *)local_108);
    std::shared_ptr<VFS::CVFS::CVFSDir>::~shared_ptr
              ((shared_ptr<VFS::CVFS::CVFSDir> *)
               &copy.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<VFS::CVFSNode>::~shared_ptr
              ((shared_ptr<VFS::CVFSNode> *)
               &DestParent.super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<VFS::CVFSNode>::~shared_ptr((shared_ptr<VFS::CVFSNode> *)local_90);
    return;
  }
  DestNode.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1
  ;
  pCVar2 = (CVFSException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Can\'t copy node. Destination node already exists.",
             (allocator<char> *)
             ((long)&DestNode.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  CVFSException::CVFSException(pCVar2,&local_78,NODE_ALREADY_EXISTS);
  DestNode.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0
  ;
  __cxa_throw(pCVar2,&CVFSException::typeinfo,CVFSException::~CVFSException);
}

Assistant:

void Copy(const std::string &From, const std::string &To)
            {
                if(!NodeExists(From))
                    throw CVFSException("Can't copy node. Source node doesn't exists.", VFSError::NODE_DOESNT_EXISTS);

                if(NodeExists(To))
                    throw CVFSException("Can't copy node. Destination node already exists.", VFSError::NODE_ALREADY_EXISTS);

                auto DestNode = GetNodeInfo(ExtractPath(To));
                if(!DestNode->IsDir())
                    throw CVFSException("Can't copy node. Destination node parent is a file.", VFSError::NODE_IS_FILE);

                auto node = GetNodeInfo(From);
                auto DestParent = std::static_pointer_cast<CVFSDir>(DestNode);

                auto copy = node->Copy();
                copy->m_Name = ExtractName(To);

                DestParent->AppendChild(copy);
            }